

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O2

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Typedef *typedef_stmt)

{
  ostream *poVar1;
  int iVar2;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  iVar2 = this->spaces_ + 2;
  this->spaces_ = iVar2;
  poVar1 = this->out_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)iVar2);
  poVar1 = std::operator<<(poVar1,(string *)local_48);
  std::operator<<(poVar1,"<typedef>\n");
  std::__cxx11::string::~string((string *)local_48);
  poVar1 = this->out_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)this->spaces_);
  poVar1 = std::operator<<(poVar1,(string *)local_48);
  poVar1 = std::operator<<(poVar1,"<type>");
  poVar1 = operator<<(poVar1,&typedef_stmt->type_);
  std::operator<<(poVar1,"</type>\n");
  std::__cxx11::string::~string((string *)local_48);
  poVar1 = this->out_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)this->spaces_ + '\x02');
  poVar1 = std::operator<<(poVar1,(string *)local_48);
  poVar1 = std::operator<<(poVar1,"<name>");
  poVar1 = std::operator<<(poVar1,(string *)
                                  &((typedef_stmt->name_).
                                    super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->identifier_);
  std::operator<<(poVar1,"</name>\n");
  std::__cxx11::string::~string((string *)local_48);
  poVar1 = this->out_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)this->spaces_);
  poVar1 = std::operator<<(poVar1,(string *)local_48);
  std::operator<<(poVar1,"<typedef>\n");
  std::__cxx11::string::~string((string *)local_48);
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Typedef& typedef_stmt) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<typedef>\n";
  out_ << std::string(spaces_, ' ') << "<type>"
       << typedef_stmt.type_ << "</type>\n";
  out_ << std::string(spaces_ + 2, ' ') << "<name>"
       << typedef_stmt.name_->String() << "</name>\n";
  out_ << std::string(spaces_, ' ') << "<typedef>\n";
  spaces_ -= TAB_SIZE;
  return 0;
}